

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.c
# Opt level: O2

void lexicon_free(lexicon_t *lexicon)

{
  hash_iter_t *itor;
  
  for (itor = hash_table_iter(lexicon->ht); itor != (hash_iter_t *)0x0;
      itor = hash_table_iter_next(itor)) {
    lexicon_entry_free((lex_entry_t *)itor->ent->val);
  }
  hash_table_free(lexicon->ht);
  ckd_free(lexicon);
  return;
}

Assistant:

void lexicon_free(lexicon_t *lexicon)
{
    hash_iter_t *itor;
    
    for (itor = hash_table_iter(lexicon->ht);
             itor; itor = hash_table_iter_next(itor)) {
        lex_entry_t *entry = hash_entry_val(itor->ent);
        lexicon_entry_free(entry);
    }
    hash_table_free(lexicon->ht);
    ckd_free(lexicon);
}